

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerup::Serialize(APowerup *this,FSerializer *arc)

{
  AActor *pAVar1;
  FSerializer *pFVar2;
  
  AInventory::Serialize(&this->super_AInventory,arc);
  pAVar1 = AActor::GetDefault((AActor *)this);
  pFVar2 = FSerializer::operator()
                     (arc,"effecttics",(int *)&(this->super_AInventory).field_0x4fc,
                      (int *)((long)&pAVar1[1].snext + 4));
  pFVar2 = FSerializer::operator()
                     (pFVar2,"blendcolor",&this->BlendColor,(PalEntry *)&pAVar1[1].sprev);
  pFVar2 = FSerializer::operator()
                     (pFVar2,"mode",&this->Mode,(FNameNoInit *)((long)&pAVar1[1].sprev + 4));
  FSerializer::operator()(pFVar2,"strength",&this->Strength,&pAVar1[1].__Pos.X);
  return;
}

Assistant:

void APowerup::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	auto def = (APowerup*)GetDefault();
	arc("effecttics", EffectTics, def->EffectTics)
		("blendcolor", BlendColor, def->BlendColor)
		("mode", Mode, def->Mode)
		("strength", Strength, def->Strength);
}